

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

int __thiscall QTextBrowserPrivate::init(QTextBrowserPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QWidget *this_00;
  long in_FS_OFFSET;
  QTextBrowser *q;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 enable;
  QWidget *in_stack_ffffffffffffff30;
  array<QMetaObject::Connection,_3UL> *in_stack_ffffffffffffff38;
  array<QMetaObject::Connection,_3UL> *this_01;
  QWidget *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff80;
  ConnectionType CVar2;
  code *receiverPrivate;
  undefined8 in_stack_ffffffffffffff90;
  Object *sender;
  Function in_stack_ffffffffffffffb0;
  offset_in_QTextDocument_to_subr in_stack_ffffffffffffffc0;
  offset_in_QWidgetTextControl_to_subr signal;
  
  CVar2 = (ConnectionType)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(this);
  this_01 = (array<QMetaObject::Connection,_3UL> *)(this->super_QTextEditPrivate).control;
  QFlags<Qt::TextInteractionFlag>::QFlags
            ((QFlags<Qt::TextInteractionFlag> *)in_stack_ffffffffffffff30,
             (TextInteractionFlag)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  enable = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  QWidgetTextControl::setTextInteractionFlags
            ((QWidgetTextControl *)in_stack_ffffffffffffff38,
             (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
             SUB84((ulong)in_stack_ffffffffffffff48 >> 0x20,0));
  QWidget::setCursor(in_stack_ffffffffffffff48,(QCursor *)this_01);
  shouldEnableInputMethod((QTextBrowser *)0x6de483);
  QWidget::setAttribute
            (this_00,(WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff90 >> 0x18,0));
  QTextEdit::setUndoRedoEnabled((QTextEdit *)in_stack_ffffffffffffff30,(bool)enable);
  QWidget::setMouseTracking(in_stack_ffffffffffffff30,(bool)enable);
  QTextEdit::document((QTextEdit *)in_stack_ffffffffffffff30);
  receiverPrivate = QTextDocument::contentsChanged;
  sender = (Object *)0x0;
  QObjectPrivate::connect<void(QTextDocument::*)(),void(QTextBrowserPrivate::*)()>
            ((Object *)0x0,in_stack_ffffffffffffffc0,(Object *)QTextDocument::contentsChanged,
             in_stack_ffffffffffffffb0,CVar2);
  CVar2 = AutoConnection;
  signal = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QString_const&),void(QTextBrowserPrivate::*)(QString_const&)>
            (sender,0,(Object *)receiverPrivate,in_stack_ffffffffffffffb0,AutoConnection);
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QString_const&),void(QTextBrowserPrivate::*)(QString_const&)>
            (sender,signal,(Object *)receiverPrivate,0,CVar2);
  std::array<QMetaObject::Connection,_3UL>::operator=(this_01,in_stack_ffffffffffffff38);
  std::array<QMetaObject::Connection,_3UL>::~array(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::init()
{
    Q_Q(QTextBrowser);
    control->setTextInteractionFlags(Qt::TextBrowserInteraction);
#ifndef QT_NO_CURSOR
    viewport->setCursor(oldCursor);
#endif
    q->setAttribute(Qt::WA_InputMethodEnabled, shouldEnableInputMethod(q));
    q->setUndoRedoEnabled(false);
    viewport->setMouseTracking(true);
    connections = {
        QObjectPrivate::connect(q->document(), &QTextDocument::contentsChanged,
                                this, &QTextBrowserPrivate::documentModified),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkActivated,
                                this, &QTextBrowserPrivate::activateAnchor),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QTextBrowserPrivate::highlightLink),
    };
}